

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiMetricsConfig::ImGuiMetricsConfig(ImGuiMetricsConfig *this)

{
  ImGuiMetricsConfig *this_local;
  
  this->ShowStackTool = false;
  this->ShowWindowsRects = false;
  this->ShowWindowsBeginOrder = false;
  this->ShowTablesRects = false;
  this->ShowDrawCmdMesh = true;
  this->ShowDrawCmdBoundingBoxes = true;
  this->ShowWindowsRectsType = -1;
  this->ShowTablesRectsType = -1;
  return;
}

Assistant:

ImGuiMetricsConfig()
    {
        ShowStackTool = false;
        ShowWindowsRects = false;
        ShowWindowsBeginOrder = false;
        ShowTablesRects = false;
        ShowDrawCmdMesh = true;
        ShowDrawCmdBoundingBoxes = true;
        ShowWindowsRectsType = -1;
        ShowTablesRectsType = -1;
    }